

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode InitiateTransfer(connectdata *conn)

{
  Curl_easy *data;
  undefined8 *puVar1;
  CURLcode CVar2;
  curl_off_t size;
  int sockindex;
  curl_off_t *bytecountp;
  int writesockindex;
  curl_off_t *writecountp;
  
  data = conn->data;
  puVar1 = (undefined8 *)(data->req).protop;
  if ((conn->bits).ftp_use_data_ssl == true) {
    Curl_infof(data,"Doing the SSL/TLS handshake on the data stream\n");
    CVar2 = Curl_ssl_connect(conn,1);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  if ((conn->proto).ftpc.state_saved == FTP_STOR) {
    *(undefined8 *)*puVar1 = 0;
    Curl_pgrsSetUploadSize(data,(data->state).infilesize);
    writecountp = (curl_off_t *)*puVar1;
    sockindex = -1;
    size = -1;
    bytecountp = (curl_off_t *)0x0;
    writesockindex = 1;
  }
  else {
    size = (conn->proto).ftpc.retr_size_saved;
    bytecountp = (curl_off_t *)*puVar1;
    writecountp = (curl_off_t *)0x0;
    sockindex = 1;
    writesockindex = -1;
  }
  Curl_setup_transfer(conn,sockindex,size,false,bytecountp,writesockindex,writecountp);
  (conn->proto).sshc.authed = true;
  (conn->proto).ftpc.state = FTP_STOP;
  return CURLE_OK;
}

Assistant:

static CURLcode InitiateTransfer(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  CURLcode result = CURLE_OK;

  if(conn->bits.ftp_use_data_ssl) {
    /* since we only have a plaintext TCP connection here, we must now
     * do the TLS stuff */
    infof(data, "Doing the SSL/TLS handshake on the data stream\n");
    result = Curl_ssl_connect(conn, SECONDARYSOCKET);
    if(result)
      return result;
  }

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    *(ftp->bytecountp) = 0;

    /* When we know we're uploading a specified file, we can get the file
       size prior to the actual upload. */

    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbufset(conn->sock[SECONDARYSOCKET]);

    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                        SECONDARYSOCKET, ftp->bytecountp);
  }
  else {
    /* FTP download: */
    Curl_setup_transfer(conn, SECONDARYSOCKET,
                        conn->proto.ftpc.retr_size_saved, FALSE,
                        ftp->bytecountp, -1, NULL); /* no upload here */
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  state(conn, FTP_STOP);

  return CURLE_OK;
}